

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t written_size;
  size_t mem_size;
  uchar *mem;
  FILE *fp;
  char **in_stack_000007c0;
  uchar **in_stack_000007c8;
  EXRHeader *in_stack_000007d0;
  EXRImage *in_stack_000007d8;
  char **in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  string *msg;
  undefined1 local_111 [33];
  size_t local_f0;
  size_t local_e8;
  void *local_e0;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  FILE *local_90;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [40];
  char *local_20;
  int local_4;
  
  if (((in_RDI == 0) || (in_RDX == (char *)0x0)) || (*(int *)(in_RSI + 0x7c) < 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Invalid argument for SaveEXRImageToFile",&local_49);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_4 = -3;
  }
  else if (*(int *)(in_RSI + 0x7c) == 0x80) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,"ZFP compression is not supported in this build",&local_81);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_4 = -10;
  }
  else {
    local_90 = (FILE *)0x0;
    local_20 = in_RDX;
    local_90 = fopen(in_RDX,"wb");
    if (local_90 == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,local_20,&local_d1);
      std::operator+(local_20,in_stack_fffffffffffffec0);
      tinyexr::SetErrorMessage(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      local_4 = -0xb;
    }
    else {
      local_e0 = (void *)0x0;
      local_e8 = SaveEXRImageToMemory
                           (in_stack_000007d8,in_stack_000007d0,in_stack_000007c8,in_stack_000007c0)
      ;
      if (local_e8 == 0) {
        local_4 = -0xc;
      }
      else {
        local_f0 = 0;
        if ((local_e8 != 0) && (local_e0 != (void *)0x0)) {
          local_f0 = fwrite(local_e0,1,local_e8,local_90);
        }
        free(local_e0);
        fclose(local_90);
        if (local_f0 == local_e8) {
          local_4 = 0;
        }
        else {
          msg = (string *)local_111;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_111 + 1),"Cannot write a file",(allocator *)msg);
          tinyexr::SetErrorMessage(msg,in_stack_fffffffffffffeb8);
          std::__cxx11::string::~string((string *)(local_111 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_111);
          local_4 = -0xb;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRImageToFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    tinyexr::SetErrorMessage("PIZ compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    tinyexr::SetErrorMessage("ZFP compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || defined(__MINGW32__)  // MSVC, MinGW gcc or clang
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"wb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }
#else
  // Unknown compiler
  fp = fopen(filename, "wb");
#endif
#else
  fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);
  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}